

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::LimitedAndReachable_NetworkCaseUnroutableAndInternal::test_method
          (LimitedAndReachable_NetworkCaseUnroutableAndInternal *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar4;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2ea;
  file.m_begin = (iterator)&local_48;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ReachableNets::Contains(&g_reachable_nets,NET_UNROUTABLE);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "g_reachable_nets.Contains(NET_UNROUTABLE)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_a8 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_b0,0x2ea);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2eb;
  file_00.m_begin = (iterator)&local_c0;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)ReachableNets::Contains(&g_reachable_nets,NET_INTERNAL);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "g_reachable_nets.Contains(NET_INTERNAL)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_d8 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_e0,0x2eb);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  ReachableNets::RemoveAll(&g_reachable_nets);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2ef;
  file_01.m_begin = (iterator)&local_f0;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
             msg_01);
  bVar1 = ReachableNets::Contains(&g_reachable_nets,NET_UNROUTABLE);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!g_reachable_nets.Contains(NET_UNROUTABLE)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_108 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_110,0x2ef);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2f0;
  file_02.m_begin = (iterator)&local_120;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_130,
             msg_02);
  bVar1 = ReachableNets::Contains(&g_reachable_nets,NET_INTERNAL);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!g_reachable_nets.Contains(NET_INTERNAL)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,0xbc3af2,(size_t)&stack0xfffffffffffffec0,0x2f0);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  ReachableNets::Add(&g_reachable_nets,NET_IPV4);
  ReachableNets::Add(&g_reachable_nets,NET_IPV6);
  ReachableNets::Add(&g_reachable_nets,NET_ONION);
  ReachableNets::Add(&g_reachable_nets,NET_I2P);
  ReachableNets::Add(&g_reachable_nets,NET_CJDNS);
  ReachableNets::Add(&g_reachable_nets,NET_UNROUTABLE);
  ReachableNets::Add(&g_reachable_nets,NET_INTERNAL);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(LimitedAndReachable_NetworkCaseUnroutableAndInternal)
{
    // Should be reachable by default.
    BOOST_CHECK(g_reachable_nets.Contains(NET_UNROUTABLE));
    BOOST_CHECK(g_reachable_nets.Contains(NET_INTERNAL));

    g_reachable_nets.RemoveAll();

    BOOST_CHECK(!g_reachable_nets.Contains(NET_UNROUTABLE));
    BOOST_CHECK(!g_reachable_nets.Contains(NET_INTERNAL));

    g_reachable_nets.Add(NET_IPV4);
    g_reachable_nets.Add(NET_IPV6);
    g_reachable_nets.Add(NET_ONION);
    g_reachable_nets.Add(NET_I2P);
    g_reachable_nets.Add(NET_CJDNS);
    g_reachable_nets.Add(NET_UNROUTABLE);
    g_reachable_nets.Add(NET_INTERNAL);
}